

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::resize
          (QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *this,qsizetype size)

{
  _func_QVariant_void_ptr_void_ptr_double **pp_Var1;
  Data *pDVar2;
  long lVar3;
  _func_QVariant_void_ptr_void_ptr_double **pp_Var4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,
               (_func_QVariant_void_ptr_void_ptr_double ***)0x0,
               (QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar3 = (this->d).size;
  if (lVar3 < size) {
    pp_Var4 = (this->d).ptr;
    pp_Var1 = pp_Var4 + lVar3;
    *pp_Var1 = (_func_QVariant_void_ptr_void_ptr_double *)0x0;
    if (pp_Var1 + 1 != pp_Var4 + size) {
      memset(pp_Var1 + 1,0,(size * 8 + lVar3 * -8) - 8);
    }
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }